

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  void *pvVar1;
  ZSTD_DDictHashSet *__ptr;
  ZSTD_DDict **__ptr_00;
  ZSTD_freeFunction p_Var2;
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  
  if (dctx == (ZSTD_DCtx *)0x0) {
    return 0;
  }
  if (dctx->staticSize != 0) {
    return 0xffffffffffffffc0;
  }
  pvVar1 = (dctx->customMem).opaque;
  p_Var2 = (dctx->customMem).customFree;
  customMem = dctx->customMem;
  ZSTD_clearDict(dctx);
  ZSTD_customFree(dctx->inBuff,customMem);
  dctx->inBuff = (char *)0x0;
  __ptr = dctx->ddictSet;
  if (__ptr == (ZSTD_DDictHashSet *)0x0) goto LAB_0016ea55;
  __ptr_00 = __ptr->ddictPtrTable;
  if (__ptr_00 == (ZSTD_DDict **)0x0) {
    if (p_Var2 != (ZSTD_freeFunction)0x0) goto LAB_0016ea32;
LAB_0016ea45:
    free(__ptr);
  }
  else {
    if (p_Var2 == (ZSTD_freeFunction)0x0) {
      free(__ptr_00);
      goto LAB_0016ea45;
    }
    (*p_Var2)(pvVar1,__ptr_00);
LAB_0016ea32:
    (*p_Var2)(pvVar1,__ptr);
  }
  dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
LAB_0016ea55:
  if (p_Var2 == (ZSTD_freeFunction)0x0) {
    free(dctx);
  }
  else {
    (*p_Var2)(pvVar1,dctx);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_customFree(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        if (dctx->ddictSet) {
            ZSTD_freeDDictHashSet(dctx->ddictSet, cMem);
            dctx->ddictSet = NULL;
        }
        ZSTD_customFree(dctx, cMem);
        return 0;
    }
}